

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

uint64_t __thiscall node::BlockManager::CalculateCurrentUsage(BlockManager *this)

{
  CBlockFileInfo *file;
  pointer pCVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&this->cs_LastBlockFile
             ,"cs_LastBlockFile",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x31e,false);
  for (pCVar1 = (this->m_blockfile_info).
                super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar1 != (this->m_blockfile_info).
                super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar1 = pCVar1 + 1) {
    uVar2 = uVar2 + (pCVar1->nUndoSize + pCVar1->nSize);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t BlockManager::CalculateCurrentUsage()
{
    LOCK(cs_LastBlockFile);

    uint64_t retval = 0;
    for (const CBlockFileInfo& file : m_blockfile_info) {
        retval += file.nSize + file.nUndoSize;
    }
    return retval;
}